

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O3

int spng_get_chrm(spng_ctx *ctx,spng_chrm *chrm)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  int iVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  iVar6 = 1;
  if ((((ctx != (spng_ctx *)0x0) &&
       (iVar6 = read_chunks(ctx,0), auVar5 = _DAT_0010c020, auVar17 = _DAT_0010c010, iVar6 == 0)) &&
      (iVar6 = 0x49, ((uint)ctx->stored & 4) != 0)) && (iVar6 = 1, chrm != (spng_chrm *)0x0)) {
    uVar1._0_4_ = (ctx->chrm_int).white_point_x;
    uVar1._4_4_ = (ctx->chrm_int).white_point_y;
    auVar10._0_8_ = uVar1 & 0xffffffff;
    auVar10._8_4_ = uVar1._4_4_;
    auVar10._12_4_ = 0;
    dVar7 = (double)DAT_0010c010;
    dVar8 = DAT_0010c010._8_8_;
    auVar9._0_8_ = SUB168(auVar10 | _DAT_0010c010,0) - dVar7;
    auVar9._8_8_ = SUB168(auVar10 | _DAT_0010c010,8) - dVar8;
    auVar10 = divpd(auVar9,_DAT_0010c020);
    chrm->white_point_x = (double)auVar10._0_8_;
    chrm->white_point_y = (double)auVar10._8_8_;
    uVar2._0_4_ = (ctx->chrm_int).red_x;
    uVar2._4_4_ = (ctx->chrm_int).red_y;
    auVar11._0_8_ = uVar2 & 0xffffffff;
    auVar11._8_4_ = uVar2._4_4_;
    auVar11._12_4_ = 0;
    auVar12._0_8_ = SUB168(auVar11 | auVar17,0) - dVar7;
    auVar12._8_8_ = SUB168(auVar11 | auVar17,8) - dVar8;
    auVar10 = divpd(auVar12,auVar5);
    chrm->red_x = (double)auVar10._0_8_;
    chrm->red_y = (double)auVar10._8_8_;
    uVar3._0_4_ = (ctx->chrm_int).blue_x;
    uVar3._4_4_ = (ctx->chrm_int).blue_y;
    auVar13._0_8_ = uVar3 & 0xffffffff;
    auVar13._8_4_ = uVar3._4_4_;
    auVar13._12_4_ = 0;
    auVar14._0_8_ = SUB168(auVar13 | auVar17,0) - dVar7;
    auVar14._8_8_ = SUB168(auVar13 | auVar17,8) - dVar8;
    auVar10 = divpd(auVar14,auVar5);
    chrm->blue_x = (double)auVar10._0_8_;
    chrm->blue_y = (double)auVar10._8_8_;
    uVar4._0_4_ = (ctx->chrm_int).green_x;
    uVar4._4_4_ = (ctx->chrm_int).green_y;
    auVar15._0_8_ = uVar4 & 0xffffffff;
    auVar15._8_4_ = uVar4._4_4_;
    auVar15._12_4_ = 0;
    auVar16._0_8_ = SUB168(auVar15 | auVar17,0) - dVar7;
    auVar16._8_8_ = SUB168(auVar15 | auVar17,8) - dVar8;
    auVar17 = divpd(auVar16,auVar5);
    chrm->green_x = (double)auVar17._0_8_;
    chrm->green_y = (double)auVar17._8_8_;
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int spng_get_chrm(spng_ctx *ctx, struct spng_chrm *chrm)
{
    SPNG_GET_CHUNK_BOILERPLATE(chrm);

    chrm->white_point_x = (double)ctx->chrm_int.white_point_x / 100000.0;
    chrm->white_point_y = (double)ctx->chrm_int.white_point_y / 100000.0;
    chrm->red_x = (double)ctx->chrm_int.red_x / 100000.0;
    chrm->red_y = (double)ctx->chrm_int.red_y / 100000.0;
    chrm->blue_y = (double)ctx->chrm_int.blue_y / 100000.0;
    chrm->blue_x = (double)ctx->chrm_int.blue_x / 100000.0;
    chrm->green_x = (double)ctx->chrm_int.green_x / 100000.0;
    chrm->green_y = (double)ctx->chrm_int.green_y / 100000.0;

    return 0;
}